

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O3

void __thiscall FWadFile::SkinHack(FWadFile *this)

{
  FWadFileLump *pFVar1;
  FWadFileLump *pFVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  anon_union_16_3_9144b11c_for_FResourceLump_3 *paVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  long lVar17;
  
  auVar5 = _DAT_005d6f70;
  auVar4 = _DAT_005d6240;
  auVar3 = _DAT_005d6230;
  if ((this->super_FResourceFile).NumLumps != 0) {
    uVar7 = 0;
    bVar9 = false;
    bVar8 = 0;
    iVar6 = SkinHack::namespc;
    do {
      pFVar1 = this->Lumps;
      paVar10 = &pFVar1[uVar7].super_FResourceLump.field_3;
      cVar11 = paVar10->Name[0];
      if (cVar11 == 'S') {
        if ((((pFVar1[uVar7].super_FResourceLump.field_3.Name[1] == '_') &&
             (pFVar1[uVar7].super_FResourceLump.field_3.Name[2] == 'S')) &&
            (pFVar1[uVar7].super_FResourceLump.field_3.Name[3] == 'K')) &&
           (((pFVar1[uVar7].super_FResourceLump.field_3.Name[4] == 'I' &&
             (pFVar1[uVar7].super_FResourceLump.field_3.Name[5] == 'N')) &&
            (*(undefined2 *)((long)&pFVar1[uVar7].super_FResourceLump.field_3 + 6) = 0, !bVar9)))) {
          uVar12 = (ulong)(this->super_FResourceFile).NumLumps;
          if (uVar12 == 0) {
            cVar11 = 'S';
          }
          else {
            pFVar2 = this->Lumps;
            lVar13 = uVar12 - 1;
            auVar14._8_4_ = (int)lVar13;
            auVar14._0_8_ = lVar13;
            auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
            auVar14 = auVar14 ^ auVar4;
            lVar13 = 0;
            auVar16 = auVar3;
            auVar18 = auVar5;
            do {
              auVar19 = auVar16 ^ auVar4;
              iVar15 = auVar14._4_4_;
              if ((bool)(~(auVar19._4_4_ == iVar15 && auVar14._0_4_ < auVar19._0_4_ ||
                          iVar15 < auVar19._4_4_) & 1)) {
                *(int *)((long)&(pFVar2->super_FResourceLump).Namespace + lVar13) = iVar6;
              }
              if ((auVar19._12_4_ != auVar14._12_4_ || auVar19._8_4_ <= auVar14._8_4_) &&
                  auVar19._12_4_ <= auVar14._12_4_) {
                *(int *)((long)&pFVar2[1].super_FResourceLump.Namespace + lVar13) = iVar6;
              }
              iVar20 = SUB164(auVar18 ^ auVar4,4);
              if (iVar20 <= iVar15 &&
                  (iVar20 != iVar15 || SUB164(auVar18 ^ auVar4,0) <= auVar14._0_4_)) {
                *(int *)((long)&pFVar2[2].super_FResourceLump.Namespace + lVar13) = iVar6;
                *(int *)((long)&pFVar2[3].super_FResourceLump.Namespace + lVar13) = iVar6;
              }
              lVar17 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 4;
              auVar16._8_8_ = lVar17 + 4;
              lVar17 = auVar18._8_8_;
              auVar18._0_8_ = auVar18._0_8_ + 4;
              auVar18._8_8_ = lVar17 + 4;
              lVar13 = lVar13 + 0x160;
            } while ((uVar12 + 3 >> 2) * 0x160 - lVar13 != 0);
            cVar11 = paVar10->Name[0];
          }
          iVar6 = iVar6 + 1;
          bVar9 = true;
          SkinHack::namespc = iVar6;
          goto LAB_004d3b88;
        }
      }
      else {
LAB_004d3b88:
        if (cVar11 == 'E') {
          if ((((byte)(pFVar1[uVar7].super_FResourceLump.field_3.Name[1] - 0x30U) < 10) &&
              (pFVar1[uVar7].super_FResourceLump.field_3.Name[2] == 'M')) &&
             ((byte)(pFVar1[uVar7].super_FResourceLump.field_3.Name[3] - 0x30U) < 10)) {
            cVar11 = pFVar1[uVar7].super_FResourceLump.field_3.Name[4];
            goto joined_r0x004d3bf3;
          }
        }
        else if ((((cVar11 == 'M') && (pFVar1[uVar7].super_FResourceLump.field_3.Name[1] == 'A')) &&
                 (pFVar1[uVar7].super_FResourceLump.field_3.Name[2] == 'P')) &&
                (((byte)(pFVar1[uVar7].super_FResourceLump.field_3.Name[3] - 0x30U) < 10 &&
                 ((byte)(pFVar1[uVar7].super_FResourceLump.field_3.Name[4] - 0x30U) < 10)))) {
          cVar11 = pFVar1[uVar7].super_FResourceLump.field_3.Name[5];
joined_r0x004d3bf3:
          if (-1 < cVar11) {
            bVar8 = 1;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->super_FResourceFile).NumLumps);
    if ((bool)(bVar9 & bVar8)) {
      Printf("\x1cHThe maps in %s will not be loaded because it has a skin.\n\x1cHYou should remove the skin from the wad to play these maps.\n"
             ,(this->super_FResourceFile).Filename);
      return;
    }
  }
  return;
}

Assistant:

void FWadFile::SkinHack ()
{
	static int namespc = ns_firstskin;
	bool skinned = false;
	bool hasmap = false;
	DWORD i;

	for (i = 0; i < NumLumps; i++)
	{
		FResourceLump *lump = &Lumps[i];

		if (lump->Name[0] == 'S' &&
			lump->Name[1] == '_' &&
			lump->Name[2] == 'S' &&
			lump->Name[3] == 'K' &&
			lump->Name[4] == 'I' &&
			lump->Name[5] == 'N')
		{ // Wad has at least one skin.
			lump->Name[6] = lump->Name[7] = 0;
			if (!skinned)
			{
				skinned = true;
				DWORD j;

				for (j = 0; j < NumLumps; j++)
				{
					Lumps[j].Namespace = namespc;
				}
				namespc++;
			}
		}
		if ((lump->Name[0] == 'M' &&
			 lump->Name[1] == 'A' &&
			 lump->Name[2] == 'P' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '0' && lump->Name[4] <= '9' &&
			 lump->Name[5] >= '\0')
			||
			(lump->Name[0] == 'E' &&
			 lump->Name[1] >= '0' && lump->Name[1] <= '9' &&
			 lump->Name[2] == 'M' &&
			 lump->Name[3] >= '0' && lump->Name[3] <= '9' &&
			 lump->Name[4] >= '\0'))
		{
			hasmap = true;
		}
	}
	if (skinned && hasmap)
	{
		Printf (TEXTCOLOR_BLUE
			"The maps in %s will not be loaded because it has a skin.\n"
			TEXTCOLOR_BLUE
			"You should remove the skin from the wad to play these maps.\n",
			Filename);
	}
}